

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

void xmlTextReaderFreeDoc(xmlTextReaderPtr reader,xmlDocPtr cur)

{
  xmlDtdPtr cur_00;
  xmlDtdPtr cur_01;
  xmlDeregisterNodeFunc *pp_Var1;
  
  if (xmlRegisterCallbacks != 0) {
    pp_Var1 = __xmlDeregisterNodeDefaultValue();
    if (*pp_Var1 != (xmlDeregisterNodeFunc)0x0) {
      pp_Var1 = __xmlDeregisterNodeDefaultValue();
      (**pp_Var1)((xmlNodePtr)cur);
    }
  }
  if ((xmlIDTablePtr)cur->ids != (xmlIDTablePtr)0x0) {
    xmlFreeIDTable((xmlIDTablePtr)cur->ids);
  }
  cur->ids = (void *)0x0;
  if ((xmlRefTablePtr)cur->refs != (xmlRefTablePtr)0x0) {
    xmlFreeRefTable((xmlRefTablePtr)cur->refs);
  }
  cur->refs = (void *)0x0;
  cur_00 = cur->intSubset;
  cur_01 = cur->extSubset;
  if (cur_01 != (xmlDtdPtr)0x0 && cur_00 != cur_01) {
    xmlUnlinkNode((xmlNodePtr)cur_01);
    cur->extSubset = (_xmlDtd *)0x0;
    xmlFreeDtd(cur_01);
  }
  if (cur_00 != (xmlDtdPtr)0x0) {
    xmlUnlinkNode((xmlNodePtr)cur->intSubset);
    cur->intSubset = (_xmlDtd *)0x0;
    xmlFreeDtd(cur_00);
  }
  if (cur->children != (xmlNodePtr)0x0) {
    xmlTextReaderFreeNodeList(reader,cur->children);
  }
  if (cur->version != (xmlChar *)0x0) {
    (*xmlFree)(cur->version);
  }
  if (cur->name != (char *)0x0) {
    (*xmlFree)(cur->name);
  }
  if (cur->encoding != (xmlChar *)0x0) {
    (*xmlFree)(cur->encoding);
  }
  if (cur->oldNs != (xmlNsPtr)0x0) {
    xmlFreeNsList(cur->oldNs);
  }
  if (cur->URL != (xmlChar *)0x0) {
    (*xmlFree)(cur->URL);
  }
  if (cur->dict != (xmlDictPtr)0x0) {
    xmlDictFree(cur->dict);
  }
  (*xmlFree)(cur);
  return;
}

Assistant:

static void
xmlTextReaderFreeDoc(xmlTextReaderPtr reader, xmlDocPtr cur) {
    xmlDtdPtr extSubset, intSubset;

    if (cur == NULL) return;

    if ((xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
	xmlDeregisterNodeDefaultValue((xmlNodePtr) cur);

    /*
     * Do this before freeing the children list to avoid ID lookups
     */
    if (cur->ids != NULL) xmlFreeIDTable((xmlIDTablePtr) cur->ids);
    cur->ids = NULL;
    if (cur->refs != NULL) xmlFreeRefTable((xmlRefTablePtr) cur->refs);
    cur->refs = NULL;
    extSubset = cur->extSubset;
    intSubset = cur->intSubset;
    if (intSubset == extSubset)
	extSubset = NULL;
    if (extSubset != NULL) {
	xmlUnlinkNode((xmlNodePtr) cur->extSubset);
	cur->extSubset = NULL;
	xmlFreeDtd(extSubset);
    }
    if (intSubset != NULL) {
	xmlUnlinkNode((xmlNodePtr) cur->intSubset);
	cur->intSubset = NULL;
	xmlFreeDtd(intSubset);
    }

    if (cur->children != NULL) xmlTextReaderFreeNodeList(reader, cur->children);

    if (cur->version != NULL) xmlFree((char *) cur->version);
    if (cur->name != NULL) xmlFree((char *) cur->name);
    if (cur->encoding != NULL) xmlFree((char *) cur->encoding);
    if (cur->oldNs != NULL) xmlFreeNsList(cur->oldNs);
    if (cur->URL != NULL) xmlFree((char *) cur->URL);
    if (cur->dict != NULL) xmlDictFree(cur->dict);

    xmlFree(cur);
}